

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void * l_alloc(void *ud,void *ptr,size_t osize,size_t nsize)

{
  size_t nsize_local;
  size_t osize_local;
  void *ptr_local;
  void *ud_local;
  
  if (nsize == 0) {
    free(ptr);
    ud_local = (void *)0x0;
  }
  else {
    ud_local = realloc(ptr,nsize);
  }
  return ud_local;
}

Assistant:

static void *l_alloc (void *ud, void *ptr, size_t osize, size_t nsize) {
  (void)ud; (void)osize;  /* not used */
  if (nsize == 0) {
    free(ptr);
    return NULL;
  }
  else
    return realloc(ptr, nsize);
}